

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O1

shared_ptr<libtorrent::torrent_plugin>
libtorrent::create_ut_pex_plugin(torrent_handle *th,client_data_t param_2)

{
  byte bVar1;
  _WordT _Var2;
  mutex_type *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  session_settings *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<libtorrent::aux::torrent> sVar6;
  shared_ptr<libtorrent::torrent_plugin> sVar7;
  unique_lock<std::mutex> local_38;
  
  sVar6 = torrent_handle::native_handle((torrent_handle *)&local_38);
  this = local_38._M_device;
  _Var5 = sVar6.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_38._9_7_,local_38._M_owns) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_38._9_7_,local_38._M_owns));
    _Var5._M_pi = extraout_RDX;
  }
  bVar1 = (((((torrent_hot_members *)((long)this + 8))->m_torrent_file).
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_flags).m_val;
  if ((bVar1 & 2) == 0) {
    if ((bVar1 & 4) != 0) {
      psVar3 = aux::torrent::settings((torrent *)this);
      local_38._M_device = &psVar3->m_mutex;
      local_38._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_38);
      local_38._M_owns = true;
      _Var2 = (psVar3->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
      ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
      _Var5._M_pi = extraout_RDX_00;
      if (((uint)_Var2 >> 0x17 & 1) == 0) goto LAB_003a9c1a;
    }
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004f8600;
    p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ut_pex_plugin_004f8650;
    *(mutex_type **)&p_Var4[1]._M_use_count = this;
    p_Var4[2]._M_use_count = 0;
    p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Atomic_word **)&p_Var4[3]._M_use_count = &p_Var4[2]._M_use_count;
    p_Var4[4]._vptr__Sp_counted_base = (_func_int **)&p_Var4[2]._M_use_count;
    p_Var4[4]._M_use_count = 0;
    p_Var4[4]._M_weak_count = 0;
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8000000000000000;
    p_Var4[5]._vptr__Sp_counted_base = (_func_int **)0x8000000000000000;
    p_Var4[5]._M_use_count = 0;
    p_Var4[5]._M_weak_count = 0;
    p_Var4[6]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined8 *)((long)&p_Var4[6]._vptr__Sp_counted_base + 4) = 0;
    *(undefined8 *)&p_Var4[6]._M_weak_count = 0;
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var4 + 1);
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
  }
  else {
LAB_003a9c1a:
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  sVar7.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var5._M_pi;
  sVar7.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)th;
  return (shared_ptr<libtorrent::torrent_plugin>)
         sVar7.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_plugin> create_ut_pex_plugin(torrent_handle const& th, client_data_t)
	{
		aux::torrent* t = th.native_handle().get();
		if (t->torrent_file().priv() || (t->torrent_file().is_i2p()
			&& !t->settings().get_bool(settings_pack::allow_i2p_mixed)))
		{
			return {};
		}
		return std::make_shared<ut_pex_plugin>(*t);
	}